

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileExecutableTargetGenerator::WriteDeviceExecutableRule
          (cmMakefileExecutableTargetGenerator *this,bool relink)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  EchoProgress *this_00;
  cmMakefile *pcVar2;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  cmGeneratorTarget *target_00;
  bool bVar4;
  bool bVar5;
  bool forResponse;
  bool useWatcomQuote_00;
  int iVar6;
  string *psVar7;
  pointer pcVar8;
  char *pcVar9;
  undefined4 extraout_var;
  pointer pcVar10;
  string *relDir;
  iterator __first;
  iterator __last;
  cmOutputConverter *local_790;
  cmOutputConverter *local_6f8;
  char *name;
  reference local_5f8;
  string *real_link_command;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string local_5c8;
  char *local_5a8;
  char *val;
  string launcher;
  string targetOutPathCompilePDB;
  string targetFullPathCompilePDB;
  undefined1 local_520 [8];
  string target;
  undefined1 local_4f8 [4];
  OutputFormat output;
  string local_4d8;
  undefined1 local_4b8 [8];
  string objectDir;
  RuleVariables vars;
  string buildObjs;
  string linkLibs;
  cmStateDirectory local_330;
  unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> local_308;
  unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> linkLineComputer;
  undefined1 local_2d8 [5];
  bool useWatcomQuote;
  bool useResponseFileForLibs;
  bool useResponseFileForObjects;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  string linkRule;
  undefined1 local_298 [8];
  string linkRuleVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  real_link_commands;
  undefined1 local_258 [7];
  bool useLinkScript;
  undefined1 local_238 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exeCleanFiles;
  allocator<char> local_1f9;
  undefined1 local_1f8 [8];
  string export_flag_var;
  string linkFlags;
  string flags;
  string local_178;
  allocator<char> local_151;
  undefined1 local_150 [8];
  string buildEcho;
  EchoProgress progress;
  undefined1 local_d0 [8];
  string targetOutputReal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string local_90;
  string *local_70;
  string *objExt;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string linkLanguage;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  bool requiresDeviceLinking;
  bool relink_local;
  cmMakefileExecutableTargetGenerator *this_local;
  
  bVar4 = requireDeviceLinking
                    ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget,
                     (cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
                     &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      ConfigName);
  if (bVar4) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&linkLanguage.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"CUDA",&local_51);
    std::allocator<char>::~allocator(&local_51);
    pcVar2 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"CMAKE_CUDA_OUTPUT_EXTENSION",
               (allocator<char> *)
               ((long)&depends.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    psVar7 = cmMakefile::GetSafeDefinition(pcVar2,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&depends.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&targetOutputReal.field_2 + 8);
    local_70 = psVar7;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(pvVar1);
    cmMakefileTargetGenerator::AppendLinkDepends
              (&this->super_cmMakefileTargetGenerator,pvVar1,(string *)local_50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&progress.Arg.field_2 + 8),
                   &((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                    GeneratorTarget)->ObjectDirectory,"cmake_device_link");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&progress.Arg.field_2 + 8),local_70);
    std::__cxx11::string::~string((string *)(progress.Arg.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=((string *)&this->DeviceLinkObject,(string *)local_d0);
    (this->super_cmMakefileTargetGenerator).NumberOfProgressActions =
         (this->super_cmMakefileTargetGenerator).NumberOfProgressActions + 1;
    if (((this->super_cmMakefileTargetGenerator).NoRuleMessages & 1U) == 0) {
      this_00 = (EchoProgress *)((long)&buildEcho.field_2 + 8);
      cmLocalUnixMakefileGenerator3::EchoProgress::EchoProgress(this_00);
      cmMakefileTargetGenerator::MakeEchoProgress(&this->super_cmMakefileTargetGenerator,this_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_150,"Linking ",&local_151);
      std::allocator<char>::~allocator(&local_151);
      std::__cxx11::string::operator+=((string *)local_150,(string *)local_50);
      std::__cxx11::string::operator+=((string *)local_150," device code ");
      pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar3);
      cmLocalGenerator::MaybeConvertToRelativePath
                ((string *)((long)&flags.field_2 + 8),(cmLocalGenerator *)pcVar3,psVar7,
                 &this->DeviceLinkObject);
      cmOutputConverter::ConvertToOutputFormat
                (&local_178,
                 &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,(string *)((long)&flags.field_2 + 8),SHELL);
      std::__cxx11::string::operator+=((string *)local_150,(string *)&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)(flags.field_2._M_local_buf + 8));
      cmLocalUnixMakefileGenerator3::AppendEcho
                ((this->super_cmMakefileTargetGenerator).LocalGenerator,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&linkLanguage.field_2 + 8),(string *)local_150,EchoLink,
                 (EchoProgress *)((long)&buildEcho.field_2 + 8));
      std::__cxx11::string::~string((string *)local_150);
      cmLocalUnixMakefileGenerator3::EchoProgress::~EchoProgress
                ((EchoProgress *)((long)&buildEcho.field_2 + 8));
    }
    std::__cxx11::string::string((string *)(linkFlags.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(export_flag_var.field_2._M_local_buf + 8));
    bVar4 = cmGeneratorTarget::IsExecutableWithExports
                      ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
    if (bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1f8,"CMAKE_EXE_EXPORTS_",&local_1f9);
      std::allocator<char>::~allocator(&local_1f9);
      std::__cxx11::string::operator+=((string *)local_1f8,(string *)local_50);
      std::__cxx11::string::operator+=((string *)local_1f8,"_FLAG");
      pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pcVar9 = cmMakefile::GetDefinition
                         ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                          Makefile,(string *)local_1f8);
      (*(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[7])
                (pcVar3,(undefined1 *)((long)&export_flag_var.field_2 + 8),pcVar9);
      std::__cxx11::string::~string((string *)local_1f8);
    }
    pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    cmLocalGenerator::GetLinkLibsCMP0065
              ((string *)
               &exeCleanFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(cmLocalGenerator *)pcVar3,
               (string *)local_50,
               (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget
              );
    (*(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
              (pcVar3,(undefined1 *)((long)&export_flag_var.field_2 + 8),
               &exeCleanFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &exeCleanFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmLocalGenerator::AddLanguageFlagsForLinking
              ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
               (string *)((long)&linkFlags.field_2 + 8),
               (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget
               ,(string *)local_50,
               &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
    cmLocalGenerator::AddArchitectureFlags
              ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
               (string *)((long)&linkFlags.field_2 + 8),
               (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget
               ,(string *)local_50,
               &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
    cmMakefileTargetGenerator::GetTargetLinkFlags
              (&this->super_cmMakefileTargetGenerator,(string *)((long)&export_flag_var.field_2 + 8)
               ,(string *)local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_238);
    pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar3);
    cmLocalGenerator::MaybeConvertToRelativePath
              ((string *)local_258,(cmLocalGenerator *)pcVar3,psVar7,(string *)local_d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_238,(value_type *)local_258);
    std::__cxx11::string::~string((string *)local_258);
    bVar4 = cmGlobalGenerator::GetUseLinkScript
                      ((cmGlobalGenerator *)(this->super_cmMakefileTargetGenerator).GlobalGenerator)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&linkRuleVar.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_298,"CMAKE_CUDA_DEVICE_LINK_EXECUTABLE",
               (allocator<char> *)(linkRule.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(linkRule.field_2._M_local_buf + 0xf));
    cmMakefileTargetGenerator::GetLinkRule
              ((string *)
               &commands1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               &this->super_cmMakefileTargetGenerator,(string *)local_298);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2d8);
    cmSystemTools::ExpandListArgument
              ((string *)
               &commands1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&linkRuleVar.field_2 + 8),false);
    bVar5 = cmMakefileTargetGenerator::CheckUseResponseFileForObjects
                      (&this->super_cmMakefileTargetGenerator,(string *)local_50);
    forResponse = cmMakefileTargetGenerator::CheckUseResponseFileForLibraries
                            (&this->super_cmMakefileTargetGenerator,(string *)local_50);
    pcVar2 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &linkLineComputer,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                   "_USE_WATCOM_QUOTE");
    useWatcomQuote_00 = cmMakefile::IsOn(pcVar2,(string *)&linkLineComputer);
    std::__cxx11::string::~string((string *)&linkLineComputer);
    cmOutputConverter::SetLinkScriptShell
              (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,bVar4);
    pcVar8 = (pointer)operator_new(0x40);
    pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    local_6f8 = (cmOutputConverter *)0x0;
    if (pcVar3 != (cmLocalUnixMakefileGenerator3 *)0x0) {
      local_6f8 = &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                   super_cmOutputConverter;
    }
    cmLocalGenerator::GetStateSnapshot
              ((cmStateSnapshot *)((long)&linkLibs.field_2 + 8),
               (cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
    cmStateSnapshot::GetDirectory(&local_330,(cmStateSnapshot *)((long)&linkLibs.field_2 + 8));
    cmLinkLineDeviceComputer::cmLinkLineDeviceComputer
              ((cmLinkLineDeviceComputer *)pcVar8,local_6f8,&local_330);
    std::unique_ptr<cmLinkLineComputer,std::default_delete<cmLinkLineComputer>>::
    unique_ptr<std::default_delete<cmLinkLineComputer>,void>
              ((unique_ptr<cmLinkLineComputer,std::default_delete<cmLinkLineComputer>> *)&local_308,
               pcVar8);
    pcVar8 = std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::
             operator->(&local_308);
    cmLinkLineComputer::SetForResponse(pcVar8,forResponse);
    pcVar8 = std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::
             operator->(&local_308);
    cmLinkLineComputer::SetUseWatcomQuote(pcVar8,useWatcomQuote_00);
    pcVar8 = std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::
             operator->(&local_308);
    cmLinkLineComputer::SetRelink(pcVar8,relink);
    std::__cxx11::string::string((string *)(buildObjs.field_2._M_local_buf + 8));
    pcVar8 = std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::get
                       (&local_308);
    cmMakefileTargetGenerator::CreateLinkLibs
              (&this->super_cmMakefileTargetGenerator,pcVar8,
               (string *)(buildObjs.field_2._M_local_buf + 8),forResponse,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&targetOutputReal.field_2 + 8));
    std::__cxx11::string::string((string *)&vars.SwiftSources);
    cmMakefileTargetGenerator::CreateObjectLists
              (&this->super_cmMakefileTargetGenerator,bVar4,false,bVar5,(string *)&vars.SwiftSources
               ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&targetOutputReal.field_2 + 8),useWatcomQuote_00);
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)((long)&objectDir.field_2 + 8));
    cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
              ((string *)local_4b8,
               (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget
              );
    pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar3);
    cmLocalGenerator::MaybeConvertToRelativePath
              ((string *)local_4f8,(cmLocalGenerator *)pcVar3,psVar7,(string *)local_4b8);
    cmOutputConverter::ConvertToOutputFormat
              (&local_4d8,
               &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,(string *)local_4f8,SHELL);
    std::__cxx11::string::operator=((string *)local_4b8,(string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)local_4f8);
    target.field_2._12_4_ = ZEXT14(useWatcomQuote_00);
    pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar3);
    cmLocalGenerator::MaybeConvertToRelativePath
              ((string *)((long)&targetFullPathCompilePDB.field_2 + 8),(cmLocalGenerator *)pcVar3,
               psVar7,(string *)local_d0);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)local_520,
               &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,(string *)((long)&targetFullPathCompilePDB.field_2 + 8),
               target.field_2._12_4_);
    std::__cxx11::string::~string((string *)(targetFullPathCompilePDB.field_2._M_local_buf + 8));
    cmCommonTargetGenerator::ComputeTargetCompilePDB_abi_cxx11_
              ((string *)((long)&targetOutPathCompilePDB.field_2 + 8),
               (cmCommonTargetGenerator *)this);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)((long)&launcher.field_2 + 8),
               &(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               (string *)((long)&targetOutPathCompilePDB.field_2 + 8),SHELL);
    vars.TargetVersionMinor = (char *)std::__cxx11::string::c_str();
    vars.Language = (char *)std::__cxx11::string::c_str();
    vars.Object = (char *)std::__cxx11::string::c_str();
    vars.Objects = (char *)std::__cxx11::string::c_str();
    vars.Target = (char *)std::__cxx11::string::c_str();
    vars.ObjectFileDir = (char *)std::__cxx11::string::c_str();
    vars.TargetInstallNameDir = (char *)std::__cxx11::string::c_str();
    vars.TargetPDB = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::string((string *)&val);
    target_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                GeneratorTarget;
    pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5c8,"RULE_LAUNCH_LINK",
               (allocator<char> *)
               ((long)&rulePlaceholderExpander._M_t.
                       super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                       .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl + 7))
    ;
    pcVar9 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar3,target_00,&local_5c8);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&rulePlaceholderExpander._M_t.
                       super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                       .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl + 7))
    ;
    local_5a8 = pcVar9;
    if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
      std::__cxx11::string::operator=((string *)&val,pcVar9);
      std::__cxx11::string::operator+=((string *)&val," ");
    }
    iVar6 = (*(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
              super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
    std::unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>::
    unique_ptr<std::default_delete<cmRulePlaceholderExpander>,void>
              ((unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>
                *)&__range1,(pointer)CONCAT44(extraout_var,iVar6));
    pcVar10 = std::
              unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
              ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                            *)&__range1);
    cmRulePlaceholderExpander::SetTargetImpLib(pcVar10,(string *)local_d0);
    pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&linkRuleVar.field_2 + 8);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(pvVar1);
    real_link_command =
         (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(pvVar1);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&real_link_command), bVar5) {
      local_5f8 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                     local_5f8);
      std::__cxx11::string::operator=((string *)local_5f8,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      pcVar10 = std::
                unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                              *)&__range1);
      pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      local_790 = (cmOutputConverter *)0x0;
      if (pcVar3 != (cmLocalUnixMakefileGenerator3 *)0x0) {
        local_790 = &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                     super_cmOutputConverter;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                (pcVar10,local_790,local_5f8,(RuleVariables *)((long)&objectDir.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    cmOutputConverter::SetLinkScriptShell
              (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,false);
    std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
    ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 *)&__range1);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)(launcher.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(targetOutPathCompilePDB.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_520);
    std::__cxx11::string::~string((string *)local_4b8);
    std::__cxx11::string::~string((string *)&vars.SwiftSources);
    std::__cxx11::string::~string((string *)(buildObjs.field_2._M_local_buf + 8));
    std::unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>::~unique_ptr
              (&local_308);
    if (bVar4) {
      pcVar9 = "dlink.txt";
      if (relink) {
        pcVar9 = "drelink.txt";
      }
      cmMakefileTargetGenerator::CreateLinkScript
                (&this->super_cmMakefileTargetGenerator,pcVar9,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&linkRuleVar.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2d8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&targetOutputReal.field_2 + 8));
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2d8,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&linkRuleVar.field_2 + 8));
    }
    pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                       ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                        Makefile);
    relDir = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                       ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
    cmLocalUnixMakefileGenerator3::CreateCDCommand
              (pcVar3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2d8,psVar7,relDir);
    cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&linkLanguage.field_2 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2d8);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              ((this->super_cmMakefileTargetGenerator).LocalGenerator,
               (ostream *)(this->super_cmMakefileTargetGenerator).BuildFileStream,(char *)0x0,
               (string *)local_d0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&targetOutputReal.field_2 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&linkLanguage.field_2 + 8),false,false);
    cmMakefileTargetGenerator::WriteTargetDriverRule
              (&this->super_cmMakefileTargetGenerator,(string *)local_d0,relink);
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_238);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_238);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&(this->super_cmMakefileTargetGenerator).CleanFiles,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__last._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2d8);
    std::__cxx11::string::~string
              ((string *)
               &commands1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_298);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&linkRuleVar.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
    std::__cxx11::string::~string((string *)(export_flag_var.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(linkFlags.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&targetOutputReal.field_2 + 8));
    std::__cxx11::string::~string((string *)local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&linkLanguage.field_2 + 8));
  }
  return;
}

Assistant:

void cmMakefileExecutableTargetGenerator::WriteDeviceExecutableRule(
  bool relink)
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  const bool requiresDeviceLinking = requireDeviceLinking(
    *this->GeneratorTarget, *this->LocalGenerator, this->ConfigName);
  if (!requiresDeviceLinking) {
    return;
  }

  std::vector<std::string> commands;

  // Get the language to use for linking this library.
  std::string linkLanguage = "CUDA";
  std::string const& objExt =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_OUTPUT_EXTENSION");

  // Build list of dependencies.
  std::vector<std::string> depends;
  this->AppendLinkDepends(depends, linkLanguage);

  // Get the name of the device object to generate.
  std::string const targetOutputReal =
    this->GeneratorTarget->ObjectDirectory + "cmake_device_link" + objExt;
  this->DeviceLinkObject = targetOutputReal;

  this->NumberOfProgressActions++;
  if (!this->NoRuleMessages) {
    cmLocalUnixMakefileGenerator3::EchoProgress progress;
    this->MakeEchoProgress(progress);
    // Add the link message.
    std::string buildEcho = "Linking ";
    buildEcho += linkLanguage;
    buildEcho += " device code ";
    buildEcho += this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeConvertToRelativePath(
        this->LocalGenerator->GetCurrentBinaryDirectory(),
        this->DeviceLinkObject),
      cmOutputConverter::SHELL);
    this->LocalGenerator->AppendEcho(
      commands, buildEcho, cmLocalUnixMakefileGenerator3::EchoLink, &progress);
  }

  // Build a list of compiler flags and linker flags.
  std::string flags;
  std::string linkFlags;

  // Add flags to create an executable.
  // Add symbol export flags if necessary.
  if (this->GeneratorTarget->IsExecutableWithExports()) {
    std::string export_flag_var = "CMAKE_EXE_EXPORTS_";
    export_flag_var += linkLanguage;
    export_flag_var += "_FLAG";
    this->LocalGenerator->AppendFlags(
      linkFlags, this->Makefile->GetDefinition(export_flag_var));
  }

  this->LocalGenerator->AppendFlags(linkFlags,
                                    this->LocalGenerator->GetLinkLibsCMP0065(
                                      linkLanguage, *this->GeneratorTarget));

  // Add language feature flags.
  this->LocalGenerator->AddLanguageFlagsForLinking(
    flags, this->GeneratorTarget, linkLanguage, this->ConfigName);

  this->LocalGenerator->AddArchitectureFlags(flags, this->GeneratorTarget,
                                             linkLanguage, this->ConfigName);

  // Add target-specific linker flags.
  this->GetTargetLinkFlags(linkFlags, linkLanguage);

  // Construct a list of files associated with this executable that
  // may need to be cleaned.
  std::vector<std::string> exeCleanFiles;
  exeCleanFiles.push_back(this->LocalGenerator->MaybeConvertToRelativePath(
    this->LocalGenerator->GetCurrentBinaryDirectory(), targetOutputReal));

  // Determine whether a link script will be used.
  bool useLinkScript = this->GlobalGenerator->GetUseLinkScript();

  // Construct the main link rule.
  std::vector<std::string> real_link_commands;
  const std::string linkRuleVar = "CMAKE_CUDA_DEVICE_LINK_EXECUTABLE";
  const std::string linkRule = this->GetLinkRule(linkRuleVar);
  std::vector<std::string> commands1;
  cmSystemTools::ExpandListArgument(linkRule, real_link_commands);

  bool useResponseFileForObjects =
    this->CheckUseResponseFileForObjects(linkLanguage);
  bool const useResponseFileForLibs =
    this->CheckUseResponseFileForLibraries(linkLanguage);

  // Expand the rule variables.
  {
    bool useWatcomQuote =
      this->Makefile->IsOn(linkRuleVar + "_USE_WATCOM_QUOTE");

    // Set path conversion for link script shells.
    this->LocalGenerator->SetLinkScriptShell(useLinkScript);

    std::unique_ptr<cmLinkLineComputer> linkLineComputer(
      new cmLinkLineDeviceComputer(
        this->LocalGenerator,
        this->LocalGenerator->GetStateSnapshot().GetDirectory()));
    linkLineComputer->SetForResponse(useResponseFileForLibs);
    linkLineComputer->SetUseWatcomQuote(useWatcomQuote);
    linkLineComputer->SetRelink(relink);

    // Collect up flags to link in needed libraries.
    std::string linkLibs;
    this->CreateLinkLibs(linkLineComputer.get(), linkLibs,
                         useResponseFileForLibs, depends);

    // Construct object file lists that may be needed to expand the
    // rule.
    std::string buildObjs;
    this->CreateObjectLists(useLinkScript, false, useResponseFileForObjects,
                            buildObjs, depends, useWatcomQuote);

    cmRulePlaceholderExpander::RuleVariables vars;
    std::string objectDir = this->GeneratorTarget->GetSupportDirectory();

    objectDir = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeConvertToRelativePath(
        this->LocalGenerator->GetCurrentBinaryDirectory(), objectDir),
      cmOutputConverter::SHELL);

    cmOutputConverter::OutputFormat output = (useWatcomQuote)
      ? cmOutputConverter::WATCOMQUOTE
      : cmOutputConverter::SHELL;
    std::string target = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeConvertToRelativePath(
        this->LocalGenerator->GetCurrentBinaryDirectory(), targetOutputReal),
      output);

    std::string targetFullPathCompilePDB = this->ComputeTargetCompilePDB();
    std::string targetOutPathCompilePDB =
      this->LocalGenerator->ConvertToOutputFormat(targetFullPathCompilePDB,
                                                  cmOutputConverter::SHELL);

    vars.Language = linkLanguage.c_str();
    vars.Objects = buildObjs.c_str();
    vars.ObjectDir = objectDir.c_str();
    vars.Target = target.c_str();
    vars.LinkLibraries = linkLibs.c_str();
    vars.Flags = flags.c_str();
    vars.LinkFlags = linkFlags.c_str();
    vars.TargetCompilePDB = targetOutPathCompilePDB.c_str();

    std::string launcher;

    const char* val = this->LocalGenerator->GetRuleLauncher(
      this->GeneratorTarget, "RULE_LAUNCH_LINK");
    if (val && *val) {
      launcher = val;
      launcher += " ";
    }

    std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->LocalGenerator->CreateRulePlaceholderExpander());

    // Expand placeholders in the commands.
    rulePlaceholderExpander->SetTargetImpLib(targetOutputReal);
    for (std::string& real_link_command : real_link_commands) {
      real_link_command = launcher + real_link_command;
      rulePlaceholderExpander->ExpandRuleVariables(this->LocalGenerator,
                                                   real_link_command, vars);
    }

    // Restore path conversion to normal shells.
    this->LocalGenerator->SetLinkScriptShell(false);
  }

  // Optionally convert the build rule to use a script to avoid long
  // command lines in the make shell.
  if (useLinkScript) {
    // Use a link script.
    const char* name = (relink ? "drelink.txt" : "dlink.txt");
    this->CreateLinkScript(name, real_link_commands, commands1, depends);
  } else {
    // No link script.  Just use the link rule directly.
    commands1 = real_link_commands;
  }
  this->LocalGenerator->CreateCDCommand(
    commands1, this->Makefile->GetCurrentBinaryDirectory(),
    this->LocalGenerator->GetBinaryDirectory());
  cmAppend(commands, commands1);
  commands1.clear();

  // Write the build rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, nullptr,
                                      targetOutputReal, depends, commands,
                                      false);

  // Write the main driver rule to build everything in this target.
  this->WriteTargetDriverRule(targetOutputReal, relink);

  // Clean all the possible executable names and symlinks.
  this->CleanFiles.insert(exeCleanFiles.begin(), exeCleanFiles.end());
#else
  static_cast<void>(relink);
#endif
}